

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TiledInputFile::readTiles
          (TiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  InputStreamMutex *pIVar2;
  pointer ppTVar3;
  TileBuffer *pTVar4;
  Int64 IVar5;
  IStream *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  Int64 *pIVar14;
  Int64 IVar15;
  undefined4 extraout_var_00;
  Task *this_00;
  InputExc *pIVar16;
  ostream *poVar17;
  ArgExc *pAVar18;
  IoExc *this_01;
  long lVar19;
  long lVar20;
  ulong uVar21;
  string *psVar22;
  int iVar23;
  string *psVar24;
  char *pcVar25;
  bool bVar26;
  stringstream _iex_throw_s;
  TaskGroup taskGroup;
  int local_340 [4];
  ostream local_330 [376];
  TaskGroup local_1b8 [392];
  undefined4 extraout_var;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar12 = pthread_mutex_lock(__mutex);
  if (iVar12 != 0) {
    std::__throw_system_error(iVar12);
  }
  pDVar1 = this->_data;
  if ((pDVar1->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar1->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TInSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar18,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (((ly | lx) < 0) ||
     ((((lx != ly && ((pDVar1->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar1->numXLevels <= lx)) ||
      (pDVar1->numYLevels <= ly)))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
    poVar17 = (ostream *)std::ostream::operator<<(local_330,lx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
    poVar17 = (ostream *)std::ostream::operator<<(poVar17,ly);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,") is invalid.",0xd);
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar18,(stringstream *)local_340);
    __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iVar12 = dx2;
  if (dx2 < dx1) {
    iVar12 = dx1;
  }
  if (dx1 < dx2) {
    dx2 = dx1;
  }
  iVar23 = dy2;
  if (dy1 < dy2) {
    iVar23 = dy1;
  }
  if (dy2 < dy1) {
    dy2 = dy1;
  }
  bVar26 = pDVar1->lineOrder != DECREASING_Y;
  iVar7 = iVar23 + -1;
  if (bVar26) {
    iVar7 = dy2 + 1;
    dy2 = iVar23;
  }
  IlmThread_2_5::TaskGroup::TaskGroup(local_1b8);
  if (dy2 != iVar7) {
    uVar21 = 0;
    do {
      uVar21 = (ulong)(int)uVar21;
      iVar23 = dx2;
      do {
        bVar11 = isValidTile(this,iVar23,dy2,lx,ly);
        if (!bVar11) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar17 = (ostream *)std::ostream::operator<<(local_330,iVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,dy2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,",",1);
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,") is not a valid tile.",0x16);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar18,(stringstream *)local_340);
          __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pDVar1 = this->_data;
        pIVar2 = pDVar1->_streamData;
        ppTVar3 = (pDVar1->tileBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar4 = ppTVar3[uVar21 % (ulong)((long)(pDVar1->tileBuffers).
                                                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)ppTVar3 >> 3)];
        IlmThread_2_5::Semaphore::wait();
        pTVar4->dx = iVar23;
        pTVar4->dy = dy2;
        pTVar4->lx = lx;
        pTVar4->ly = ly;
        pTVar4->uncompressedData = (char *)0x0;
        pIVar14 = TileOffsets::operator()(&pDVar1->tileOffsets,iVar23,dy2,lx,ly);
        IVar5 = *pIVar14;
        if (IVar5 == 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,"Tile (",6);
          poVar17 = (ostream *)std::ostream::operator<<(local_330,iVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,dy2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,lx);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,") is missing.",0xd);
          pIVar16 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar16,(stringstream *)local_340);
          __cxa_throw(pIVar16,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        if ((pDVar1->version & 0x1000) == 0) {
          IVar15 = pIVar2->currentPosition;
        }
        else {
          iVar13 = (*pIVar2->is->_vptr_IStream[5])();
          IVar15 = CONCAT44(extraout_var,iVar13);
        }
        if (IVar15 != IVar5) {
          (*pIVar2->is->_vptr_IStream[6])(pIVar2->is,IVar5);
        }
        if (((pDVar1->version & 0x1000) != 0) &&
           ((*pIVar2->is->_vptr_IStream[3])(pIVar2->is,local_340,4),
           local_340[0] != pDVar1->partNumber)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)local_340);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_330,"Unexpected part number ",0x17);
          poVar17 = (ostream *)std::ostream::operator<<(local_330,local_340[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,", should be ",0xc);
          poVar17 = (ostream *)std::ostream::operator<<(poVar17,pDVar1->partNumber);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,".",1);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar18,(stringstream *)local_340);
          __cxa_throw(pAVar18,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,local_340,4);
        iVar13 = local_340[0];
        (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,local_340,4);
        iVar8 = local_340[0];
        (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,local_340,4);
        iVar9 = local_340[0];
        (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,local_340,4);
        iVar10 = local_340[0];
        (*pIVar2->is->_vptr_IStream[3])(pIVar2->is,local_340,4);
        pTVar4->dataSize = local_340[0];
        if (iVar23 != iVar13) {
          pcVar25 = "Unexpected tile x coordinate.";
LAB_001dc3a2:
          pIVar16 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar16,pcVar25);
          __cxa_throw(pIVar16,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        if (iVar8 != dy2) {
          pcVar25 = "Unexpected tile y coordinate.";
          goto LAB_001dc3a2;
        }
        if (iVar9 != lx) {
          pcVar25 = "Unexpected tile x level number coordinate.";
          goto LAB_001dc3a2;
        }
        if (iVar10 != ly) {
          pcVar25 = "Unexpected tile y level number coordinate.";
          goto LAB_001dc3a2;
        }
        if ((local_340[0] < 0) || ((int)pDVar1->tileBufferSize < local_340[0])) {
          pcVar25 = "Unexpected tile block length.";
          goto LAB_001dc3a2;
        }
        iVar13 = (*pIVar2->is->_vptr_IStream[2])();
        pIVar6 = pIVar2->is;
        if ((char)iVar13 == '\0') {
          (*pIVar6->_vptr_IStream[3])(pIVar6,pTVar4->buffer,(ulong)(uint)pTVar4->dataSize);
        }
        else {
          iVar13 = (*pIVar6->_vptr_IStream[4])(pIVar6,(ulong)(uint)pTVar4->dataSize);
          pTVar4->buffer = (char *)CONCAT44(extraout_var_00,iVar13);
        }
        pIVar2->currentPosition = (long)pTVar4->dataSize + IVar5 + 0x14;
        this_00 = (Task *)operator_new(0x20);
        IlmThread_2_5::Task::Task(this_00,local_1b8);
        *(undefined ***)this_00 = &PTR__TileBufferTask_0043c6c8;
        *(Data **)(this_00 + 0x10) = pDVar1;
        *(TileBuffer **)(this_00 + 0x18) = pTVar4;
        IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
        iVar23 = iVar23 + 1;
        uVar21 = uVar21 + 1;
      } while (iVar12 + 1 != iVar23);
      dy2 = dy2 + (uint)bVar26 * 2 + -1;
    } while (dy2 != iVar7);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1b8);
  ppTVar3 = (this->_data->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar19 = (long)(this->_data->tileBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3;
  if (lVar19 == 0) {
    psVar22 = (string *)0x0;
  }
  else {
    lVar19 = lVar19 >> 3;
    lVar20 = 0;
    psVar24 = (string *)0x0;
    do {
      pTVar4 = ppTVar3[lVar20];
      psVar22 = (string *)&pTVar4->exception;
      if (psVar24 != (string *)0x0) {
        psVar22 = psVar24;
      }
      if (pTVar4->hasException == false) {
        psVar22 = psVar24;
      }
      pTVar4->hasException = false;
      lVar20 = lVar20 + 1;
      psVar24 = psVar22;
    } while (lVar19 + (ulong)(lVar19 == 0) != lVar20);
  }
  if (psVar22 != (string *)0x0) {
    this_01 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::IoExc::IoExc(this_01,psVar22);
    __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
TiledInputFile::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data destination.");
        
        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //
                               
        if (dx1 > dx2)
            std::swap (dx1, dx2);
        
        if (dy1 > dy2)
            std::swap (dy1, dy2);
        
        int dyStart = dy1;
	int dyStop  = dy2 + 1;
	int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
	// task group goes out of scope, the destructor waits until
	// all tasks are complete.
        //
        
        {
            TaskGroup taskGroup;
            int tileNumber = 0;
    
            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (IEX_NAMESPACE::ArgExc,
			       "Tile (" << dx << ", " << dy << ", " <<
			       lx << "," << ly << ") is not a valid tile.");
                    
                    ThreadPool::addGlobalTask (newTileBufferTask (&taskGroup,
                                                                  _data->_streamData,
                                                                  _data,
                                                                  tileNumber++,
                                                                  dx, dy,
                                                                  lx, ly));
                }
            }

	    //
            // finish all tasks
	    //
        }

	//
	// Exeption handling:
	//
	// TileBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to TiledInputFile::readTiles().
	// TileBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the tile buffers.
	// Now we check if any tile buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple tile buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
	{
            TileBuffer *tileBuffer = _data->tileBuffers[i];

	    if (tileBuffer->hasException && !exception)
		exception = &tileBuffer->exception;

	    tileBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}